

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  undefined1 local_90 [8];
  string delimiter;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_90 = (undefined1  [8])&delimiter._M_string_length;
  delimiter._M_dataplus._M_p = (pointer)0x0;
  delimiter._M_string_length._0_1_ = 0;
  bVar2 = ConsumeMessageDelimiter(this,(string *)local_90);
  if (bVar2) {
    do {
      delimiter.field_2._8_8_ = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&delimiter.field_2 + 8),">","");
      sVar1 = (this->tokenizer_).current_.text._M_string_length;
      if (sVar1 == local_68) {
        if (sVar1 == 0) {
          bVar2 = true;
        }
        else {
          iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                       (void *)delimiter.field_2._8_8_,sVar1);
          bVar2 = iVar3 == 0;
        }
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
LAB_002fdada:
        bVar4 = false;
      }
      else {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"}","");
        sVar1 = (this->tokenizer_).current_.text._M_string_length;
        bVar4 = true;
        if (sVar1 == local_48) {
          if (sVar1 == 0) goto LAB_002fdada;
          iVar3 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar1);
          bVar4 = iVar3 != 0;
        }
      }
      if ((!bVar2) && (local_50 != local_40)) {
        operator_delete(local_50);
      }
      if ((undefined1 *)delimiter.field_2._8_8_ != local_60) {
        operator_delete((void *)delimiter.field_2._8_8_);
      }
      if (!bVar4) {
        bVar2 = Consume(this,(string *)local_90);
        goto LAB_002fdb72;
      }
      bVar2 = SkipField(this);
    } while (bVar2);
  }
  bVar2 = false;
LAB_002fdb72:
  if (local_90 != (undefined1  [8])&delimiter._M_string_length) {
    operator_delete((void *)local_90);
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));
    return true;
  }